

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall capnp::JsonCodec::JsonCodec(JsonCodec *this)

{
  JsonCodec *this_local;
  
  kj::heap<capnp::JsonCodec::Impl>();
  return;
}

Assistant:

JsonCodec::JsonCodec()
    : impl(kj::heap<Impl>()) {}